

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npn.hpp
# Opt level: O2

tuple<kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
* __thiscall
kitty::
exact_npn_canonization<kitty::static_truth_table<4u,true>,void(kitty::static_truth_table<4u,true>const&)>
          (tuple<kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *__return_storage_ptr__,kitty *this,static_truth_table<4U,_true> *tt,
          _func_void_static_truth_table<4U,_true>_ptr *fn)

{
  uint8_t uVar1;
  uchar uVar2;
  static_truth_table<4U,_true> sVar3;
  long lVar4;
  uint uVar5;
  size_t i;
  ulong uVar6;
  ulong uVar7;
  bool local_75;
  int local_74;
  int local_70;
  allocator_type local_69;
  static_truth_table<4U,_true> t2;
  static_truth_table<4U,_true> t1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> perm;
  
  t1._bits = *(uint64_t *)this;
  t2._bits = (uint64_t)(~(uint)t1._bits & 0xffff);
  sVar3._bits = t1._bits;
  if (t2._bits < t1._bits) {
    sVar3._bits = t2._bits;
  }
  local_75 = t2._bits <= t1._bits;
  (*(code *)tt)(&t1);
  (*(code *)tt)(&t2);
  local_74 = -1;
  for (uVar6 = 0; uVar6 < (ulong)(detail::swaps._56_8_ - detail::swaps._48_8_); uVar6 = uVar6 + 1) {
    uVar1 = *(uint8_t *)(detail::swaps._48_8_ + uVar6);
    swap_adjacent_inplace<4u>(&t1,uVar1);
    swap_adjacent_inplace<4u>(&t2,uVar1);
    (*(code *)tt)(&t1);
    (*(code *)tt)(&t2);
    if (t2._bits < sVar3._bits || t1._bits < sVar3._bits) {
      sVar3 = t1;
      if (t2._bits < t1._bits) {
        sVar3 = t2;
      }
      local_75 = t2._bits <= t1._bits;
      local_74 = (int)uVar6;
    }
  }
  local_70 = -1;
  for (uVar6 = 0; uVar6 < (ulong)(detail::flips._56_8_ - detail::flips._48_8_); uVar6 = uVar6 + 1) {
    uVar1 = *(uint8_t *)(detail::flips._48_8_ + uVar6);
    swap_adjacent_inplace<4u>(&t1,'\0');
    flip_inplace<4u>(&t1,uVar1);
    swap_adjacent_inplace<4u>(&t2,'\0');
    flip_inplace<4u>(&t2,uVar1);
    (*(code *)tt)(&t1);
    (*(code *)tt)(&t2);
    if (t2._bits < sVar3._bits || t1._bits < sVar3._bits) {
      sVar3 = t1;
      if (t2._bits < t1._bits) {
        sVar3 = t2;
      }
      local_75 = t2._bits <= t1._bits;
      local_74 = -1;
      local_70 = (int)uVar6;
    }
    for (uVar7 = 0; uVar7 < (ulong)(detail::swaps._56_8_ - detail::swaps._48_8_); uVar7 = uVar7 + 1)
    {
      uVar1 = *(uint8_t *)(detail::swaps._48_8_ + uVar7);
      swap_adjacent_inplace<4u>(&t1,uVar1);
      swap_adjacent_inplace<4u>(&t2,uVar1);
      (*(code *)tt)(&t1);
      (*(code *)tt)(&t2);
      if (t2._bits < sVar3._bits || t1._bits < sVar3._bits) {
        sVar3 = t1;
        if (t2._bits < t1._bits) {
          sVar3 = t2;
        }
        local_75 = t2._bits <= t1._bits;
        local_74 = (int)uVar7;
        local_70 = (int)uVar6;
      }
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&perm,4,&local_69);
  for (lVar4 = 0;
      perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + lVar4 !=
      perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish; lVar4 = lVar4 + 1) {
    perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[lVar4] = (uchar)lVar4;
  }
  for (lVar4 = 0; lVar4 <= local_74; lVar4 = lVar4 + 1) {
    uVar6 = (ulong)*(byte *)(detail::swaps._48_8_ + lVar4);
    uVar2 = perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6];
    perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] =
         perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[uVar6 + 1];
    perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6 + 1] = uVar2;
  }
  uVar5 = (uint)(byte)(local_75 << 4);
  for (lVar4 = 0; lVar4 <= local_70; lVar4 = lVar4 + 1) {
    uVar5 = uVar5 ^ 1 << (*(byte *)(detail::flips._48_8_ + lVar4) & 0x1f);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,&perm);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ).
  super__Tuple_impl<1UL,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
  super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = uVar5;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ).super__Head_base<0UL,_kitty::static_truth_table<4U,_true>,_false>._M_head_impl._bits =
       sVar3._bits;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<TT, uint32_t, std::vector<uint8_t>> exact_npn_canonization( const TT& tt, Callback&& fn = detail::exact_npn_canonization_null_callback<TT> )
{
  static_assert( is_complete_truth_table<TT>::value, "Can only be applied on complete truth tables." );

  const auto num_vars = tt.num_vars();

  /* Special case for n = 0 */
  if ( num_vars == 0 )
  {
    const auto bit = get_bit( tt, 0 );
    return std::make_tuple( unary_not_if( tt, bit ), static_cast<uint32_t>( bit ), std::vector<uint8_t>{} );
  }

  /* Special case for n = 1 */
  if ( num_vars == 1 )
  {
    const auto bit1 = get_bit( tt, 1 );
    return std::make_tuple( unary_not_if( tt, bit1 ), static_cast<uint32_t>( bit1 << 1 ), std::vector<uint8_t>{ 0 } );
  }

  assert( num_vars >= 2 && num_vars <= 6 );

  auto t1 = tt, t2 = ~tt;
  auto tmin = std::min( t1, t2 );
  auto invo = tmin == t2;

  fn( t1 );
  fn( t2 );

  const auto& swaps = detail::swaps[num_vars - 2u];
  const auto& flips = detail::flips[num_vars - 2u];

  int best_swap = -1;
  int best_flip = -1;

  for ( std::size_t i = 0; i < swaps.size(); ++i )
  {
    const auto pos = swaps[i];
    swap_adjacent_inplace( t1, pos );
    swap_adjacent_inplace( t2, pos );

    fn( t1 );
    fn( t2 );

    if ( t1 < tmin || t2 < tmin )
    {
      best_swap = static_cast<int>( i );
      tmin = std::min( t1, t2 );
      invo = tmin == t2;
    }
  }

  for ( std::size_t j = 0; j < flips.size(); ++j )
  {
    const auto pos = flips[j];
    swap_adjacent_inplace( t1, 0 );
    flip_inplace( t1, pos );
    swap_adjacent_inplace( t2, 0 );
    flip_inplace( t2, pos );

    fn( t1 );
    fn( t2 );

    if ( t1 < tmin || t2 < tmin )
    {
      best_swap = -1;
      best_flip = static_cast<int>( j );
      tmin = std::min( t1, t2 );
      invo = tmin == t2;
    }

    for ( std::size_t i = 0; i < swaps.size(); ++i )
    {
      const auto pos = swaps[i];
      swap_adjacent_inplace( t1, pos );
      swap_adjacent_inplace( t2, pos );

      fn( t1 );
      fn( t2 );

      if ( t1 < tmin || t2 < tmin )
      {
        best_swap = static_cast<int>( i );
        best_flip = static_cast<int>( j );
        tmin = std::min( t1, t2 );
        invo = tmin == t2;
      }
    }
  }

  std::vector<uint8_t> perm( num_vars );
  std::iota( perm.begin(), perm.end(), 0u );

  for ( auto i = 0; i <= best_swap; ++i )
  {
    const auto pos = swaps[i];
    std::swap( perm[pos], perm[pos + 1] );
  }

  uint32_t phase = uint32_t( invo ) << num_vars;
  for ( auto i = 0; i <= best_flip; ++i )
  {
    phase ^= 1 << flips[i];
  }

  return std::make_tuple( tmin, phase, perm );
}